

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgnometheme.cpp
# Opt level: O1

void __thiscall QGnomeThemePrivate::~QGnomeThemePrivate(QGnomeThemePrivate *this)

{
  QFont *pQVar1;
  QDBusPendingCallWatcher *pQVar2;
  QDBusListener *pQVar3;
  
  (this->super_QGenericUnixThemePrivate).super_QPlatformThemePrivate._vptr_QPlatformThemePrivate =
       (_func_int **)&PTR__QGnomeThemePrivate_007f41f8;
  pQVar1 = this->systemFont;
  if (pQVar1 != (QFont *)0x0) {
    QFont::~QFont(pQVar1);
    operator_delete(pQVar1,0x10);
  }
  pQVar1 = this->fixedFont;
  if (pQVar1 != (QFont *)0x0) {
    QFont::~QFont(pQVar1);
    operator_delete(pQVar1,0x10);
  }
  pQVar2 = (this->pendingCallWatcher)._M_t.
           super___uniq_ptr_impl<QDBusPendingCallWatcher,_std::default_delete<QDBusPendingCallWatcher>_>
           ._M_t.
           super__Tuple_impl<0UL,_QDBusPendingCallWatcher_*,_std::default_delete<QDBusPendingCallWatcher>_>
           .super__Head_base<0UL,_QDBusPendingCallWatcher_*,_false>._M_head_impl;
  if (pQVar2 != (QDBusPendingCallWatcher *)0x0) {
    (**(code **)(*(long *)pQVar2 + 0x20))();
  }
  (this->pendingCallWatcher)._M_t.
  super___uniq_ptr_impl<QDBusPendingCallWatcher,_std::default_delete<QDBusPendingCallWatcher>_>._M_t
  .super__Tuple_impl<0UL,_QDBusPendingCallWatcher_*,_std::default_delete<QDBusPendingCallWatcher>_>.
  super__Head_base<0UL,_QDBusPendingCallWatcher_*,_false>._M_head_impl =
       (QDBusPendingCallWatcher *)0x0;
  pQVar3 = (this->dbus)._M_t.
           super___uniq_ptr_impl<QDBusListener,_std::default_delete<QDBusListener>_>._M_t.
           super__Tuple_impl<0UL,_QDBusListener_*,_std::default_delete<QDBusListener>_>.
           super__Head_base<0UL,_QDBusListener_*,_false>._M_head_impl;
  if (pQVar3 != (QDBusListener *)0x0) {
    (**(code **)(*(long *)pQVar3 + 0x20))();
  }
  (this->dbus)._M_t.super___uniq_ptr_impl<QDBusListener,_std::default_delete<QDBusListener>_>._M_t.
  super__Tuple_impl<0UL,_QDBusListener_*,_std::default_delete<QDBusListener>_>.
  super__Head_base<0UL,_QDBusListener_*,_false>._M_head_impl = (QDBusListener *)0x0;
  (this->super_QGenericUnixThemePrivate).super_QPlatformThemePrivate._vptr_QPlatformThemePrivate =
       (_func_int **)&PTR__QGenericUnixThemePrivate_007f4108;
  QFont::~QFont(&(this->super_QGenericUnixThemePrivate).fixedFont);
  QFont::~QFont(&(this->super_QGenericUnixThemePrivate).systemFont);
  QPlatformThemePrivate::~QPlatformThemePrivate((QPlatformThemePrivate *)this);
  return;
}

Assistant:

QGnomeThemePrivate::~QGnomeThemePrivate()
{
    if (systemFont)
        delete systemFont;
    if (fixedFont)
        delete fixedFont;
}